

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.c
# Opt level: O0

_Bool os_mkdir(char *path,_Bool exist_ok)

{
  _Bool _Var1;
  int iVar2;
  int mkres;
  mode_t mode;
  _Bool exist_ok_local;
  char *path_local;
  
  if ((exist_ok) && (_Var1 = os_direxists(path), _Var1)) {
    path_local._7_1_ = true;
  }
  else {
    iVar2 = mkdir(path,0x1fd);
    if (iVar2 == -1) {
      path_local._7_1_ = false;
    }
    else {
      path_local._7_1_ = true;
    }
  }
  return path_local._7_1_;
}

Assistant:

bool os_mkdir(char *path, bool exist_ok) {
#if defined(__linux__) || defined(__FreeBSD__) || defined(__OpenBSD__) ||      \
    defined(__NetBSD__) || defined(__DragonFly__)
    if (exist_ok && os_direxists(path)) {
        return true;
    } else {
        mode_t mode = S_IRWXU | S_IRWXG | S_IROTH | S_IXOTH;
        int mkres = mkdir(path, mode);
        if (mkres == -1) {
            return false;
        } else {
            return true;
        }
    }

#elif __APPLE__
#error "TODO os_mkdir for APPLE platform"
#else
#error "TODO os_mkdir for WINDOWS platform"
#endif
}